

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QStringList * QDirPrivate::splitFilters(QString *nameFilter,QChar sep)

{
  bool bVar1;
  iterator *this;
  char16_t in_DX;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  TokenizerResult<const_QString_&,_QChar_&> *__range1;
  QStringList *ret;
  QStringView e;
  sentinel __end1;
  iterator __begin1;
  rvalue_ref in_stack_fffffffffffffef8;
  QStringTokenizerBase<QStringView,_QChar> *in_stack_ffffffffffffff00;
  QStringView *nameFilter_00;
  undefined1 local_68 [60];
  char16_t local_2c;
  QChar local_2a;
  QStringTokenizerBase<QStringView,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  nameFilter_00 = in_RDI;
  local_2a.ucs = in_DX;
  bVar1 = QChar::isNull(&local_2a);
  if (bVar1) {
    local_2c = (char16_t)getFilterSepChar((QString *)nameFilter_00);
    local_2a = (QChar)local_2c;
  }
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x288772);
  qTokenize<QString_const&,QChar&>((QString *)nameFilter_00,(QChar *)in_RDI);
  memset(local_68,0xaa,0x38);
  QStringTokenizerBase<QStringView,_QChar>::begin(in_stack_ffffffffffffff00);
  QStringTokenizerBase<QStringView,_QChar>::end(&local_28);
  while (bVar1 = ::operator!=(local_68), bVar1) {
    this = (iterator *)
           QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x28881a);
    QStringView::trimmed(in_RDI);
    QStringView::toString((QStringView *)this);
    QList<QString>::append((QList<QString> *)this,in_stack_fffffffffffffef8);
    QString::~QString((QString *)0x288874);
    QStringTokenizerBase<QStringView,_QChar>::iterator::operator++(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)nameFilter_00;
  }
  __stack_chk_fail();
}

Assistant:

inline QStringList QDirPrivate::splitFilters(const QString &nameFilter, QChar sep)
{
    if (sep.isNull())
        sep = getFilterSepChar(nameFilter);
    QStringList ret;
    for (auto e : qTokenize(nameFilter, sep))
        ret.append(e.trimmed().toString());
    return ret;
}